

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O3

void __thiscall Assimp::D3MF::XmlSerializer::ReadMetadata(XmlSerializer *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MetaEntry entry;
  string name;
  string value;
  undefined1 local_98 [32];
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 *local_58;
  long local_50;
  undefined1 local_48 [16];
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  iVar1 = (*this->xmlReader->_vptr_IIrrXMLReader[7])(this->xmlReader,XmlTag::meta_name_abi_cxx11_);
  std::__cxx11::string::string
            ((string *)&local_58,(char *)CONCAT44(extraout_var,iVar1),(allocator *)local_98);
  (*this->xmlReader->_vptr_IIrrXMLReader[2])();
  iVar1 = (*this->xmlReader->_vptr_IIrrXMLReader[0xe])();
  std::__cxx11::string::string
            ((string *)local_38,(char *)CONCAT44(extraout_var_00,iVar1),(allocator *)local_98);
  if (local_50 != 0) {
    local_98._8_8_ = 0;
    local_98[0x10] = '\0';
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    local_98._0_8_ = local_98 + 0x10;
    local_78._M_p = (pointer)&local_68;
    std::__cxx11::string::_M_assign((string *)local_98);
    std::__cxx11::string::_M_assign((string *)&local_78);
    std::
    vector<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
    ::push_back(&this->mMetaData,(value_type *)local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p);
    }
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_);
    }
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void ReadMetadata() {
        const std::string name = xmlReader->getAttributeValue( D3MF::XmlTag::meta_name.c_str() );
        xmlReader->read();
        const std::string value = xmlReader->getNodeData();

        if ( name.empty() ) {
            return;
        }

        MetaEntry entry;
        entry.name = name;
        entry.value = value;
        mMetaData.push_back( entry );
    }